

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantum.cpp
# Opt level: O0

void __thiscall quantum::QuantumComputer::displayInfo(QuantumComputer *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  size_type sVar4;
  reference pdVar5;
  double x;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  int i;
  QuantumComputer *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"*****");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Information about state");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Current register size(qubits): ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->registerSize);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Register is normalized: ");
  pcVar3 = boolToString((bool)(this->isNormalize & 1));
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Register is measured: ");
  pcVar3 = boolToString((bool)(this->isMeasured & 1));
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Size of baseVector: ");
  sVar4 = std::vector<double,_std::allocator<double>_>::size(&this->baseVector);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Values in baseVector array: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __range1._4_4_ = 0;
  __end1 = std::vector<double,_std::allocator<double>_>::begin(&this->baseVector);
  x = (double)std::vector<double,_std::allocator<double>_>::end(&this->baseVector);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&x);
    if (!bVar1) break;
    pdVar5 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    printf("  index [%d] value [%.4f] \n",*pdVar5,(ulong)__range1._4_4_);
    __range1._4_4_ = __range1._4_4_ + 1;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"*****");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void quantum::QuantumComputer::displayInfo() {



    std::cout << "*****" << std::endl;
    std::cout << "Information about state" << std::endl;
    std::cout << "Current register size(qubits): " << this->registerSize << std::endl;
    std::cout << "Register is normalized: " << boolToString(this->isNormalize) << std::endl;
    std::cout << "Register is measured: " << boolToString(this->isMeasured) << std::endl;
    std::cout << "Size of baseVector: " << this->baseVector.size() << std::endl;
    std::cout << "Values in baseVector array: " << std::endl;
    int i = 0;
    for (auto x: this->baseVector) {
        printf("  index [%d] value [%.4f] \n",i, x);
        i++;
    }
    std::cout << "*****" << std::endl;
}